

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_pwm_multi_duty(APITests *this)

{
  int iVar1;
  long in_RDI;
  double max_ct;
  double min_ct;
  int delta;
  int i;
  int N;
  PWM p;
  int count;
  double pct;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<double> *__range1;
  initializer_list<double> *in_stack_ffffffffffffff30;
  allocator *paVar2;
  allocator local_a9;
  string local_a8 [32];
  double local_88;
  double local_80;
  undefined4 uVar3;
  int iVar4;
  undefined1 in_stack_ffffffffffffff97;
  PWM local_60 [12];
  int local_54;
  double local_50;
  const_iterator local_48;
  const_iterator local_40;
  double local_38 [3];
  initializer_list<double> local_20;
  initializer_list<double> *local_10;
  
  local_38[0] = 25.0;
  local_38[1] = 50.0;
  local_38[2] = 75.0;
  local_20._M_array = local_38;
  local_20._M_len = 3;
  local_10 = &local_20;
  local_40 = std::initializer_list<double>::begin(local_10);
  local_48 = std::initializer_list<double>::end(in_stack_ffffffffffffff30);
  for (; local_40 != local_48; local_40 = local_40 + 1) {
    local_50 = *local_40;
    GPIO::setmode(BOARD);
    GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
    GPIO::setup(*(int *)(in_RDI + 0x20),OUT,1);
    local_54 = 0;
    GPIO::PWM::PWM(local_60,*(int *)(in_RDI + 0x20),500);
    GPIO::PWM::start(local_50);
    for (iVar4 = 0; iVar4 < 5000; iVar4 = iVar4 + 1) {
      iVar1 = GPIO::input(*(int *)(in_RDI + 0x24));
      local_54 = iVar1 + local_54;
    }
    GPIO::PWM::stop();
    uVar3 = 5;
    local_80 = ((local_50 - 5.0) * 5000.0) / 100.0;
    local_88 = ((local_50 + 5.0) * 5000.0) / 100.0;
    paVar2 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",paVar2);
    assert::is_true((bool)in_stack_ffffffffffffff97,(string *)CONCAT44(iVar4,uVar3));
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    GPIO::cleanup();
    GPIO::PWM::~PWM(local_60);
  }
  return;
}

Assistant:

void test_pwm_multi_duty()
    {
        for (auto pct : {25.0, 50.0, 75.0})
        {
            GPIO::setmode(GPIO::BOARD);
            GPIO::setup(pin_data.in_a, GPIO::IN);
            GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

            int count = 0;

            GPIO::PWM p(pin_data.out_a, 500);
            p.start(pct);
            constexpr int N = 5000;
            for (int i = 0; i < N; i++)
                count += GPIO::input(pin_data.in_a);

            p.stop();

            const auto delta = 5;
            const auto min_ct = N * (pct - delta) / 100.0;
            const auto max_ct = N * (pct + delta) / 100.0;

            assert::is_true(min_ct <= count && count <= max_ct);
            GPIO::cleanup();
        }
    }